

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PipelineClient::writeTarget
          (PipelineClient *this,Builder target)

{
  Builder builder_00;
  QuestionId value;
  QuestionRef *this_00;
  ClientHook *extraout_RDX;
  long in_RSI;
  Orphanage orphanage;
  ArrayPtr<const_capnp::PipelineOp> ops;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> MVar1;
  PipelineClient *pPVar2;
  Orphan<capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>_> local_60;
  undefined1 auStack_40 [8];
  Builder builder;
  PipelineClient *this_local;
  
  pPVar2 = this;
  rpc::MessageTarget::Builder::initPromisedAnswer((Builder *)auStack_40,&target);
  this_00 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::
            operator->((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>
                        *)(in_RSI + 0x40));
  value = QuestionRef::getId(this_00);
  rpc::PromisedAnswer::Builder::setQuestionId((Builder *)auStack_40,value);
  builder_00._builder.capTable = builder._builder.capTable;
  builder_00._builder.segment = builder._builder.segment;
  builder_00._builder.data = builder._builder.data;
  builder_00._builder.pointers = builder._builder.pointers;
  builder_00._builder._32_8_ = pPVar2;
  orphanage = Orphanage::getForMessageContaining<capnp::rpc::PromisedAnswer::Builder>(builder_00);
  ops = kj::Array::operator_cast_to_ArrayPtr((Array *)(in_RSI + 0x50));
  anon_unknown_18::fromPipelineOps(&local_60,orphanage,ops);
  rpc::PromisedAnswer::Builder::adoptTransform((Builder *)auStack_40,&local_60);
  Orphan<capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>_>::~Orphan(&local_60);
  kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Maybe
            ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)pPVar2);
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>)MVar1.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> writeTarget(
        rpc::MessageTarget::Builder target) override {
      auto builder = target.initPromisedAnswer();
      builder.setQuestionId(questionRef->getId());
      builder.adoptTransform(fromPipelineOps(Orphanage::getForMessageContaining(builder), ops));
      return kj::none;
    }